

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayoutengine.cpp
# Opt level: O2

void __thiscall QGridLayoutRowInfo::insertOrRemoveRows(QGridLayoutRowInfo *this,int row,int delta)

{
  char *__filename;
  ulong n;
  long in_FS_OFFSET;
  QGridLayoutBox local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this->count = this->count + delta;
  __filename = (char *)(long)row;
  n = (ulong)(uint)delta;
  if (row < (int)(this->stretches).d.size) {
    if (delta < 1) {
      if (delta < 0) {
        QList<QStretchParameter>::remove(&this->stretches,__filename);
      }
    }
    else {
      local_58.q_minimumSize = 2.12199579047121e-314;
      QList<QStretchParameter>::insert
                (&this->stretches,(qsizetype)__filename,n,(parameter_type)&local_58);
    }
  }
  if (row < (int)(this->spacings).d.size) {
    if (delta < 1) {
      if (delta < 0) {
        QList<QLayoutParameter<double>_>::remove(&this->spacings,__filename);
      }
    }
    else {
      local_58.q_minimumSize = 0.0;
      local_58.q_preferredSize = (qreal)((ulong)local_58.q_preferredSize & 0xffffffff00000000);
      QList<QLayoutParameter<double>_>::insert
                (&this->spacings,(qsizetype)__filename,n,(parameter_type)&local_58);
    }
  }
  if (row < (int)(this->alignments).d.size) {
    if (delta < 1) {
      if (delta < 0) {
        QList<QFlags<Qt::AlignmentFlag>_>::remove(&this->alignments,__filename);
      }
    }
    else {
      local_58.q_minimumSize = (qreal)((ulong)local_58.q_minimumSize & 0xffffffff00000000);
      QList<QFlags<Qt::AlignmentFlag>_>::insert
                (&this->alignments,(qsizetype)__filename,n,(parameter_type)&local_58);
    }
  }
  if (row < (int)(this->boxes).d.size) {
    if (delta < 1) {
      if (delta < 0) {
        QList<QGridLayoutBox>::remove(&this->boxes,__filename);
      }
    }
    else {
      local_58.q_minimumSize = 0.0;
      local_58.q_preferredSize = 0.0;
      local_58.q_maximumSize = 3.4028234663852886e+38;
      local_58.q_minimumDescent = -1.0;
      local_58.q_minimumAscent = -1.0;
      QList<QGridLayoutBox>::insert(&this->boxes,(qsizetype)__filename,n,&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGridLayoutRowInfo::insertOrRemoveRows(int row, int delta)
{
    count += delta;

    insertOrRemoveItems(stretches, row, delta);
    insertOrRemoveItems(spacings, row, delta);
    insertOrRemoveItems(alignments, row, delta);
    insertOrRemoveItems(boxes, row, delta);
}